

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::~Company(Company *this)

{
  Employee **ppEVar1;
  Employee *this_00;
  Boss *this_01;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    iVar2 = Boss::getNumberOfEmployees(this->boss);
    ppEVar1 = this->employees;
    if (iVar2 <= lVar3) break;
    this_00 = ppEVar1[lVar3];
    if (this_00 != (Employee *)0x0) {
      Person::~Person(&this_00->super_Person);
    }
    operator_delete(this_00,0xb8);
    lVar3 = lVar3 + 1;
  }
  if (ppEVar1 != (Employee **)0x0) {
    operator_delete__(ppEVar1);
  }
  this_01 = this->boss;
  if (this_01 != (Boss *)0x0) {
    Person::~Person((Person *)this_01);
  }
  operator_delete(this_01,0xc0);
  return;
}

Assistant:

Company::~Company() {
    // delete memory of all of the employees and boss
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        delete employees[i];
    }
    delete[] employees;
    delete boss;
}